

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SphereTriangleDetector.cpp
# Opt level: O2

bool __thiscall
SphereTriangleDetector::pointInTriangle
          (SphereTriangleDetector *this,btVector3 *vertices,btVector3 *normal,btVector3 *p)

{
  btVector3 *v1;
  btVector3 *v1_00;
  bool bVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  btVector3 bVar5;
  btVector3 bVar6;
  btVector3 bVar7;
  btVector3 bVar8;
  btVector3 bVar9;
  btVector3 bVar10;
  btVector3 edge2;
  btVector3 edge1;
  btVector3 edge3;
  float local_108;
  float local_f8;
  float local_e8;
  float fStack_e4;
  float local_d8;
  float fStack_d4;
  float local_c8;
  float fStack_c4;
  float local_b8;
  float fStack_b4;
  float local_a8;
  float local_98;
  float fStack_94;
  float local_88;
  float local_78;
  btVector3 local_60;
  btVector3 local_50;
  btVector3 local_40;
  
  v1 = vertices + 1;
  v1_00 = vertices + 2;
  local_50 = operator-(v1,vertices);
  local_60 = operator-(v1_00,v1);
  local_40 = operator-(vertices,v1_00);
  bVar5 = operator-(p,vertices);
  bVar6 = operator-(p,v1);
  bVar7 = operator-(p,v1_00);
  bVar8 = btVector3::cross(&local_50,normal);
  bVar9 = btVector3::cross(&local_60,normal);
  bVar10 = btVector3::cross(&local_40,normal);
  local_108 = bVar9.m_floats[2];
  local_f8 = bVar8.m_floats[2];
  local_c8 = bVar5.m_floats[0];
  fStack_c4 = bVar5.m_floats[1];
  local_e8 = bVar8.m_floats[0];
  fStack_e4 = bVar8.m_floats[1];
  local_a8 = bVar5.m_floats[2];
  fVar3 = local_f8 * local_a8 + local_e8 * local_c8 + fStack_c4 * fStack_e4;
  local_b8 = bVar6.m_floats[0];
  fStack_b4 = bVar6.m_floats[1];
  local_d8 = bVar9.m_floats[0];
  fStack_d4 = bVar9.m_floats[1];
  local_88 = bVar6.m_floats[2];
  fVar4 = local_108 * local_88 + local_d8 * local_b8 + fStack_b4 * fStack_d4;
  local_98 = bVar7.m_floats[0];
  fStack_94 = bVar7.m_floats[1];
  local_78 = bVar7.m_floats[2];
  fVar2 = bVar10.m_floats[2] * local_78 +
          bVar10.m_floats[0] * local_98 + fStack_94 * bVar10.m_floats[1];
  if (((fVar3 <= 0.0) || (fVar4 <= 0.0)) || (bVar1 = true, fVar2 <= 0.0)) {
    bVar1 = (bool)(fVar2 <= 0.0 & -(fVar3 <= 0.0) & -(fVar4 <= 0.0));
  }
  return bVar1;
}

Assistant:

bool SphereTriangleDetector::pointInTriangle(const btVector3 vertices[], const btVector3 &normal, btVector3 *p )
{
	const btVector3* p1 = &vertices[0];
	const btVector3* p2 = &vertices[1];
	const btVector3* p3 = &vertices[2];

	btVector3 edge1( *p2 - *p1 );
	btVector3 edge2( *p3 - *p2 );
	btVector3 edge3( *p1 - *p3 );

	btVector3 p1_to_p( *p - *p1 );
	btVector3 p2_to_p( *p - *p2 );
	btVector3 p3_to_p( *p - *p3 );

	btVector3 edge1_normal( edge1.cross(normal));
	btVector3 edge2_normal( edge2.cross(normal));
	btVector3 edge3_normal( edge3.cross(normal));
	
	btScalar r1, r2, r3;
	r1 = edge1_normal.dot( p1_to_p );
	r2 = edge2_normal.dot( p2_to_p );
	r3 = edge3_normal.dot( p3_to_p );
	if ( ( r1 > 0 && r2 > 0 && r3 > 0 ) ||
	     ( r1 <= 0 && r2 <= 0 && r3 <= 0 ) )
		return true;
	return false;

}